

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
               (OpCode op,OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  undefined6 in_register_0000003a;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0xe0) {
    Output::Print(L" [%d], %d, %d ",(ulong)data->R0,(ulong)data->R1,(ulong)data->R2);
    return;
  }
  DumpReg(data->R0);
  DumpReg(data->R1);
  DumpReg(data->R2);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg3(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case OpCode::NewInnerScopeSlots:
            Output::Print(_u(" [%d], %d, %d "), data->R0, data->R1, data->R2);
            break;

        default:
            DumpReg(data->R0);
            DumpReg(data->R1);
            DumpReg(data->R2);
            break;
        }
    }